

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_TestExact(char *pFileName)

{
  int nVars_00;
  int iVar1;
  FILE *__stream;
  Vec_Wrd_t *vTruths;
  word *pIn1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int nNodes;
  int nLutSize;
  int nVars;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  word pSpec [4];
  char Line [1000];
  
  nVars = -1;
  nLutSize = -1;
  nNodes = -1;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return;
  }
  iVar1 = Zyx_TestGetTruthTablePars(pFileName,pSpec,&nVars,&nLutSize,&nNodes);
  nVars_00 = nVars;
  iVar3 = nNodes;
  if (iVar1 == 0) {
    return;
  }
  if (nVars < 9) {
    local_43c = nLutSize;
    if (nLutSize < 7) {
      if (nNodes < 0x11) {
        vTruths = Zyx_TestCreateTruthTables(nVars,nNodes);
        local_440 = iVar3 + nVars_00;
        bVar2 = (char)nVars_00 - 6;
        local_444 = 1 << (bVar2 & 0x1f);
        if (nVars_00 < 7) {
          local_444 = 1;
        }
        if (nVars_00 < 7) {
          bVar2 = 0;
        }
        local_448 = iVar3 + -1 + nVars_00 << (bVar2 & 0x1f);
        uVar5 = 0;
        iVar3 = nVars_00;
        do {
          pcVar4 = fgets(Line,1000,__stream);
          if (pcVar4 == (char *)0x0) {
LAB_004a9c43:
            Vec_WrdFree(vTruths);
            fclose(__stream);
            return;
          }
          iVar1 = Zyx_TestReadNode(Line,vTruths,nVars_00,local_43c,iVar3);
          if (iVar1 == 0) {
            if (iVar3 != local_440) {
              puts("The number of nodes in the structure is not correct.");
              goto LAB_004a9c43;
            }
            uVar5 = uVar5 + 1;
            pIn1 = Vec_WrdEntryP(vTruths,local_448);
            iVar1 = Abc_TtEqual(pIn1,pSpec,local_444);
            iVar3 = nVars_00 + -1;
            if (iVar1 == 0) {
              printf("Structure %3d : Verification FAILED.\n",(ulong)uVar5);
              printf("Implementation: ");
              Dau_DsdPrintFromTruth(pIn1,nVars_00);
              printf("Specification:  ");
              Dau_DsdPrintFromTruth(pSpec,nVars_00);
            }
            else {
              printf("Structure %3d : Verification successful.\n",(ulong)uVar5);
            }
          }
          iVar3 = iVar3 + 1;
        } while( true );
      }
      pcVar4 = "This tester does not support structures with more than 16 inputs.";
    }
    else {
      pcVar4 = "This tester does not support nodes with more than 6 inputs.";
    }
  }
  else {
    pcVar4 = "This tester does not support functions with more than 8 inputs.";
  }
  puts(pcVar4);
  return;
}

Assistant:

void Zyx_TestExact( char * pFileName )
{
    int iObj, nStrs = 0, nVars = -1, nLutSize = -1, nNodes = -1;
    word * pImpl, pSpec[4]; Vec_Wrd_t * vInfo; char Line[1000];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return;
    }
    if ( !Zyx_TestGetTruthTablePars( pFileName, pSpec, &nVars, &nLutSize, &nNodes ) )
        return;
    if ( nVars > 8 )
    {
        printf( "This tester does not support functions with more than 8 inputs.\n" );
        return;
    }
    if ( nLutSize > 6 )
    {
        printf( "This tester does not support nodes with more than 6 inputs.\n" );
        return;
    }
    if ( nNodes > 16 )
    {
        printf( "This tester does not support structures with more than 16 inputs.\n" );
        return;
    }
    vInfo = Zyx_TestCreateTruthTables( nVars, nNodes );
    for ( iObj = nVars; fgets(Line, 1000, pFile) != NULL; iObj++ )
    {
        if ( Zyx_TestReadNode( Line, vInfo, nVars, nLutSize, iObj ) )
            continue;
        if ( iObj != nVars + nNodes )
        {
            printf( "The number of nodes in the structure is not correct.\n" );
            break;
        }
        nStrs++;
        pImpl = Zyx_TestTruth( vInfo, iObj-1, Abc_TtWordNum(nVars) );
        if ( Abc_TtEqual( pImpl, pSpec, Abc_TtWordNum(nVars) ) )
            printf( "Structure %3d : Verification successful.\n", nStrs );
        else
        {
            printf( "Structure %3d : Verification FAILED.\n", nStrs );
            printf( "Implementation: " ); Dau_DsdPrintFromTruth( pImpl, nVars );
            printf( "Specification:  " ); Dau_DsdPrintFromTruth( pSpec, nVars );
        }
        iObj = nVars - 1;
    }
    Vec_WrdFree( vInfo );
    fclose( pFile );
}